

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O3

void __thiscall
QLocalServerPrivate::waitForNewConnection(QLocalServerPrivate *this,int msec,bool *timedOut)

{
  int iVar1;
  int *piVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QString local_70;
  QDeadlineTimer local_58;
  pollfd local_48;
  QArrayData *local_40;
  char16_t *local_38;
  qsizetype qStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (pollfd)((ulong)(uint)this->listenSocket | 0x100000000);
  QDeadlineTimer::QDeadlineTimer(&local_58,(long)msec,CoarseTimer);
  iVar1 = qt_safe_poll(&local_48,1,local_58);
  if (iVar1 != -1) {
    if (iVar1 == 0) {
      if (timedOut != (bool *)0x0) {
        *timedOut = true;
      }
      goto LAB_002429d0;
    }
    if (((ulong)local_48 & 0x20000000000000) == 0) {
      _q_onNewConnection(this);
      goto LAB_002429d0;
    }
    piVar2 = __errno_location();
    *piVar2 = 9;
  }
  QVar3.m_data = (storage_type *)0x22;
  QVar3.m_size = (qsizetype)&local_40;
  QString::fromLatin1(QVar3);
  local_70.d.d = (Data *)local_40;
  local_70.d.ptr = local_38;
  local_70.d.size = qStack_30;
  setError(this,&local_70);
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  closeServer(this);
LAB_002429d0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalServerPrivate::waitForNewConnection(int msec, bool *timedOut)
{
    pollfd pfd = qt_make_pollfd(listenSocket, POLLIN);
    switch (qt_safe_poll(&pfd, 1, QDeadlineTimer(msec))) {
    case 0:
        if (timedOut)
            *timedOut = true;

        return;
        break;
    default:
        if ((pfd.revents & POLLNVAL) == 0) {
            _q_onNewConnection();
            return;
        }

        errno = EBADF;
        Q_FALLTHROUGH();
    case -1:
        setError("QLocalServer::waitForNewConnection"_L1);
        closeServer();
        break;
    }
}